

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# smtp.c
# Opt level: O0

CURLcode smtp_perform_command(Curl_easy *data)

{
  connectdata *pcVar1;
  SMTP *pSVar2;
  _Bool _Var3;
  CURLcode CVar4;
  int iVar5;
  char *pcVar6;
  char *pcVar7;
  bool bVar8;
  char *local_b0;
  char *local_90;
  byte local_62;
  byte local_61;
  undefined1 local_60 [8];
  hostname host;
  char *address;
  _Bool utf8;
  SMTP *smtp;
  connectdata *conn;
  CURLcode result;
  Curl_easy *data_local;
  
  pcVar1 = data->conn;
  pSVar2 = (data->req).p.smtp;
  if (pSVar2->rcpt == (curl_slist *)0x0) {
    if ((pSVar2->custom == (char *)0x0) || (*pSVar2->custom == '\0')) {
      local_b0 = "HELP";
    }
    else {
      local_b0 = pSVar2->custom;
    }
    conn._4_4_ = Curl_pp_sendf(data,&(pcVar1->proto).ftpc.pp,"%s",local_b0);
  }
  else if ((pSVar2->custom == (char *)0x0) || (*pSVar2->custom == '\0')) {
    host.dispname = (char *)0x0;
    memset(local_60,0,0x20);
    CVar4 = smtp_parse_address(pSVar2->rcpt->data,&host.dispname,(hostname *)local_60);
    if (CVar4 != CURLE_OK) {
      return CVar4;
    }
    local_61 = 0;
    if ((*(byte *)((long)&pcVar1->proto + 0xd0) >> 3 & 1) != 0) {
      local_62 = 1;
      if (host.rawalloc == (char *)0x0) {
        _Var3 = Curl_is_ASCII_name(host.dispname);
        local_62 = 1;
        if (_Var3) {
          _Var3 = Curl_is_ASCII_name(host.encalloc);
          local_62 = _Var3 ^ 0xff;
        }
      }
      local_61 = local_62;
    }
    pcVar6 = "";
    if (host.encalloc == (char *)0x0) {
      local_90 = "";
    }
    else {
      pcVar6 = "@";
      local_90 = host.encalloc;
    }
    pcVar7 = "";
    if ((local_61 & 1) != 0) {
      pcVar7 = " SMTPUTF8";
    }
    conn._4_4_ = Curl_pp_sendf(data,&(pcVar1->proto).ftpc.pp,"VRFY %s%s%s%s",host.dispname,pcVar6,
                               local_90,pcVar7);
    (*Curl_cfree)(host.dispname);
  }
  else {
    bVar8 = false;
    if ((*(byte *)((long)&pcVar1->proto + 0xd0) >> 3 & 1) != 0) {
      iVar5 = strcmp(pSVar2->custom,"EXPN");
      bVar8 = iVar5 == 0;
    }
    pcVar6 = "";
    if (bVar8) {
      pcVar6 = " SMTPUTF8";
    }
    conn._4_4_ = Curl_pp_sendf(data,&(pcVar1->proto).ftpc.pp,"%s %s%s",pSVar2->custom,
                               pSVar2->rcpt->data,pcVar6);
  }
  if (conn._4_4_ == CURLE_OK) {
    smtp_state(data,SMTP_COMMAND);
  }
  return conn._4_4_;
}

Assistant:

static CURLcode smtp_perform_command(struct Curl_easy *data)
{
  CURLcode result = CURLE_OK;
  struct connectdata *conn = data->conn;
  struct SMTP *smtp = data->req.p.smtp;

  if(smtp->rcpt) {
    /* We notify the server we are sending UTF-8 data if a) it supports the
       SMTPUTF8 extension and b) The mailbox contains UTF-8 characters, in
       either the local address or hostname parts. This is regardless of
       whether the hostname is encoded using IDN ACE */
    bool utf8 = FALSE;

    if((!smtp->custom) || (!smtp->custom[0])) {
      char *address = NULL;
      struct hostname host = { NULL, NULL, NULL, NULL };

      /* Parse the mailbox to verify into the local address and hostname
         parts, converting the hostname to an IDN A-label if necessary */
      result = smtp_parse_address(smtp->rcpt->data,
                                  &address, &host);
      if(result)
        return result;

      /* Establish whether we should report SMTPUTF8 to the server for this
         mailbox as per RFC-6531 sect. 3.1 point 6 */
      utf8 = (conn->proto.smtpc.utf8_supported) &&
             ((host.encalloc) || (!Curl_is_ASCII_name(address)) ||
              (!Curl_is_ASCII_name(host.name)));

      /* Send the VRFY command (Note: The hostname part may be absent when the
         host is a local system) */
      result = Curl_pp_sendf(data, &conn->proto.smtpc.pp, "VRFY %s%s%s%s",
                             address,
                             host.name ? "@" : "",
                             host.name ? host.name : "",
                             utf8 ? " SMTPUTF8" : "");

      Curl_free_idnconverted_hostname(&host);
      free(address);
    }
    else {
      /* Establish whether we should report that we support SMTPUTF8 for EXPN
         commands to the server as per RFC-6531 sect. 3.1 point 6 */
      utf8 = (conn->proto.smtpc.utf8_supported) &&
             (!strcmp(smtp->custom, "EXPN"));

      /* Send the custom recipient based command such as the EXPN command */
      result = Curl_pp_sendf(data, &conn->proto.smtpc.pp,
                             "%s %s%s", smtp->custom,
                             smtp->rcpt->data,
                             utf8 ? " SMTPUTF8" : "");
    }
  }
  else
    /* Send the non-recipient based command such as HELP */
    result = Curl_pp_sendf(data, &conn->proto.smtpc.pp, "%s",
                           smtp->custom && smtp->custom[0] != '\0' ?
                           smtp->custom : "HELP");

  if(!result)
    smtp_state(data, SMTP_COMMAND);

  return result;
}